

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cParallelShaderCompileTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::CompilationCompletionParallelTest::iterate(CompilationCompletionParallelTest *this)

{
  glCompileShaderFunc p_Var1;
  glAttachShaderFunc p_Var2;
  bool bVar3;
  int iVar4;
  GLenum GVar5;
  GLuint GVar6;
  deUint32 dVar7;
  ContextInfo *this_00;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  size_t sVar9;
  deUint64 dVar10;
  deUint64 dVar11;
  int local_148;
  int local_144;
  int i_8;
  int i_7;
  deUint64 prLoopStart;
  int completion_1;
  int i_6;
  int i_5;
  int local_124;
  int i_4;
  int i_3;
  deUint64 shLoopStart;
  int local_110;
  int completion;
  int i_2;
  int fLengths [1];
  char *fSources [1];
  int i_1;
  int vLengths [1];
  char *vSources [1];
  int local_dc;
  GLuint GStack_d8;
  int i;
  deUint32 program [8];
  deUint32 fragmentShader [8];
  undefined1 local_90 [8];
  Shader vertexShader;
  GLint completionStatus;
  Functions *gl;
  CompilationCompletionParallelTest *this_local;
  Functions *gl_00;
  
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar3 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_parallel_shader_compile");
  if (bVar3) {
    pRVar8 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    iVar4 = (*pRVar8->_vptr_RenderContext[3])();
    gl_00 = (Functions *)CONCAT44(extraout_var,iVar4);
    (*gl_00->maxShaderCompilerThreadsARB)(8);
    GVar5 = (*gl_00->getError)();
    glu::checkError(GVar5,"maxShaderCompilerThreadsARB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0x123);
    glu::Shader::Shader((Shader *)local_90,gl_00,SHADERTYPE_VERTEX);
    for (local_dc = 0; local_dc < 8; local_dc = local_dc + 1) {
      GVar6 = (*gl_00->createShader)(0x8b30);
      program[(long)local_dc + 6] = GVar6;
      GVar6 = (*gl_00->createProgram)();
      (&GStack_d8)[local_dc] = GVar6;
    }
    _i_1 = vShader;
    sVar9 = strlen(vShader);
    fSources[0]._4_4_ = (undefined4)sVar9;
    glu::Shader::setSources((Shader *)local_90,1,(char **)&i_1,(int *)((long)fSources + 4));
    for (fSources[0]._0_4_ = 0; (int)fSources[0] < 8; fSources[0]._0_4_ = (int)fSources[0] + 1) {
      _i_2 = fShader;
      sVar9 = strlen(fShader);
      completion = (int)sVar9;
      (*gl_00->shaderSource)(program[(long)(int)fSources[0] + 6],1,(GLchar **)&i_2,&completion);
    }
    p_Var1 = gl_00->compileShader;
    dVar7 = glu::Shader::getShader((Shader *)local_90);
    (*p_Var1)(dVar7);
    GVar5 = (*gl_00->getError)();
    glu::checkError(GVar5,"compileShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0x13d);
    for (local_110 = 0; local_110 < 8; local_110 = local_110 + 1) {
      (*gl_00->compileShader)(program[(long)local_110 + 6]);
      GVar5 = (*gl_00->getError)();
      glu::checkError(GVar5,"compileShader",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                      ,0x141);
    }
    shLoopStart._4_4_ = 0;
    dVar10 = deGetMicroseconds();
    while( true ) {
      bVar3 = false;
      if (shLoopStart._4_4_ != 8) {
        dVar11 = deGetMicroseconds();
        bVar3 = dVar11 < dVar10 + 1000000;
      }
      if (!bVar3) break;
      shLoopStart._4_4_ = 0;
      for (local_124 = 0; local_124 < 8; local_124 = local_124 + 1) {
        (*gl_00->getShaderiv)
                  (program[(long)local_124 + 6],0x91b1,
                   (GLint *)((long)&vertexShader.m_info.compileTimeUs + 4));
        GVar5 = (*gl_00->getError)();
        glu::checkError(GVar5,"getShaderiv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                        ,0x14d);
        if (vertexShader.m_info.compileTimeUs._4_4_ != 0) {
          shLoopStart._4_4_ = shLoopStart._4_4_ + 1;
        }
      }
    }
    if (shLoopStart._4_4_ == 8) {
      for (completion_1 = 0; completion_1 < 8; completion_1 = completion_1 + 1) {
        p_Var2 = gl_00->attachShader;
        GVar6 = (&GStack_d8)[completion_1];
        dVar7 = glu::Shader::getShader((Shader *)local_90);
        (*p_Var2)(GVar6,dVar7);
        GVar5 = (*gl_00->getError)();
        glu::checkError(GVar5,"attachShader",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                        ,0x162);
        (*gl_00->attachShader)((&GStack_d8)[completion_1],program[(long)completion_1 + 6]);
        GVar5 = (*gl_00->getError)();
        glu::checkError(GVar5,"attachShader",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                        ,0x164);
      }
      for (prLoopStart._4_4_ = 0; prLoopStart._4_4_ < 8; prLoopStart._4_4_ = prLoopStart._4_4_ + 1)
      {
        (*gl_00->linkProgram)((&GStack_d8)[prLoopStart._4_4_]);
        GVar5 = (*gl_00->getError)();
        glu::checkError(GVar5,"linkProgram",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                        ,0x16b);
      }
      prLoopStart._0_4_ = 0;
      dVar10 = deGetMicroseconds();
      while( true ) {
        bVar3 = false;
        if ((int)prLoopStart != 8) {
          dVar11 = deGetMicroseconds();
          bVar3 = dVar11 < dVar10 + 1000000;
        }
        if (!bVar3) break;
        prLoopStart._0_4_ = 0;
        for (local_144 = 0; local_144 < 8; local_144 = local_144 + 1) {
          (*gl_00->getProgramiv)
                    ((&GStack_d8)[local_144],0x91b1,
                     (GLint *)((long)&vertexShader.m_info.compileTimeUs + 4));
          GVar5 = (*gl_00->getError)();
          glu::checkError(GVar5,"getProgramiv",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                          ,0x177);
          if (vertexShader.m_info.compileTimeUs._4_4_ != 0) {
            prLoopStart._0_4_ = (int)prLoopStart + 1;
          }
        }
      }
      if ((int)prLoopStart == 8) {
        bVar3 = false;
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,
                   "Failed reading completion status for parallel program linking");
        for (local_148 = 0; local_148 < 8; local_148 = local_148 + 1) {
          (*gl_00->deleteProgram)((&GStack_d8)[local_148]);
          (*gl_00->deleteShader)(program[(long)local_148 + 6]);
        }
        this_local._4_4_ = STOP;
        bVar3 = true;
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Failed reading completion status for parallel shader compiling");
      for (i_5 = 0; i_5 < 8; i_5 = i_5 + 1) {
        (*gl_00->deleteProgram)((&GStack_d8)[i_5]);
        (*gl_00->deleteShader)(program[(long)i_5 + 6]);
      }
      this_local._4_4_ = STOP;
      bVar3 = true;
    }
    glu::Shader::~Shader((Shader *)local_90);
    if (!bVar3) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      this_local._4_4_ = STOP;
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not supported");
    this_local._4_4_ = STOP;
  }
  return this_local._4_4_;
}

Assistant:

tcu::TestNode::IterateResult CompilationCompletionParallelTest::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_parallel_shader_compile"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
		return STOP;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	GLint completionStatus;

	gl.maxShaderCompilerThreadsARB(8);
	GLU_EXPECT_NO_ERROR(gl.getError(), "maxShaderCompilerThreadsARB");

	{
		Shader   vertexShader(gl, SHADERTYPE_VERTEX);
		deUint32 fragmentShader[8];
		deUint32 program[8];

		for (int i = 0; i < 8; ++i)
		{
			fragmentShader[i] = gl.createShader(GL_FRAGMENT_SHADER);
			program[i]		  = gl.createProgram();
		}

		const char* vSources[] = { vShader };
		const int   vLengths[] = { int(strlen(vShader)) };
		vertexShader.setSources(1, vSources, vLengths);

		//Compilation test
		for (int i = 0; i < 8; ++i)
		{
			const char* fSources[] = { fShader };
			const int   fLengths[] = { int(strlen(fShader)) };
			gl.shaderSource(fragmentShader[i], 1, fSources, fLengths);
		}

		gl.compileShader(vertexShader.getShader());
		GLU_EXPECT_NO_ERROR(gl.getError(), "compileShader");
		for (int i = 0; i < 8; ++i)
		{
			gl.compileShader(fragmentShader[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "compileShader");
		}

		{
			int		 completion  = 0;
			deUint64 shLoopStart = deGetMicroseconds();
			while (completion != 8 && deGetMicroseconds() < shLoopStart + 1000000)
			{
				completion = 0;
				for (int i = 0; i < 8; ++i)
				{
					gl.getShaderiv(fragmentShader[i], GL_COMPLETION_STATUS_ARB, &completionStatus);
					GLU_EXPECT_NO_ERROR(gl.getError(), "getShaderiv");
					if (completionStatus)
						completion++;
				}
			}
			if (completion != 8)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL,
										"Failed reading completion status for parallel shader compiling");
				for (int i = 0; i < 8; ++i)
				{
					gl.deleteProgram(program[i]);
					gl.deleteShader(fragmentShader[i]);
				}
				return STOP;
			}
		}

		for (int i = 0; i < 8; ++i)
		{
			gl.attachShader(program[i], vertexShader.getShader());
			GLU_EXPECT_NO_ERROR(gl.getError(), "attachShader");
			gl.attachShader(program[i], fragmentShader[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "attachShader");
		}

		//Linking test
		for (int i = 0; i < 8; ++i)
		{
			gl.linkProgram(program[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "linkProgram");
		}

		{
			int		 completion  = 0;
			deUint64 prLoopStart = deGetMicroseconds();
			while (completion != 8 && deGetMicroseconds() < prLoopStart + 1000000)
			{
				completion = 0;
				for (int i = 0; i < 8; ++i)
				{
					gl.getProgramiv(program[i], GL_COMPLETION_STATUS_ARB, &completionStatus);
					GLU_EXPECT_NO_ERROR(gl.getError(), "getProgramiv");
					if (completionStatus)
						completion++;
				}
			}
			if (completion != 8)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL,
										"Failed reading completion status for parallel program linking");
				for (int i = 0; i < 8; ++i)
				{
					gl.deleteProgram(program[i]);
					gl.deleteShader(fragmentShader[i]);
				}
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}